

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

size_t ptls_aead_encrypt(ptls_aead_context_t *ctx,void *output,void *input,size_t inlen,uint64_t seq
                        ,void *aad,size_t aadlen)

{
  size_t sVar1;
  long lVar2;
  size_t sVar3;
  uint8_t iv [16];
  size_t local_50;
  undefined1 local_48 [24];
  
  sVar3 = ctx->algo->iv_size;
  local_50 = inlen;
  if (sVar3 - 8 != 0) {
    memcpy(local_48,ctx->static_iv,sVar3 - 8);
  }
  lVar2 = 0x38;
  do {
    local_48[sVar3 - 8] = (byte)(seq >> ((byte)lVar2 & 0x3f)) ^ ctx->static_iv[sVar3 - 8];
    lVar2 = lVar2 + -8;
    sVar3 = sVar3 + 1;
  } while (lVar2 != -8);
  (*ctx->do_encrypt_init)(ctx,local_48,aad,aadlen);
  sVar3 = (*ctx->do_encrypt_update)(ctx,output,input,local_50);
  sVar1 = (*ctx->do_encrypt_final)(ctx,(void *)((long)output + sVar3));
  return sVar1 + sVar3;
}

Assistant:

size_t ptls_aead_encrypt(ptls_aead_context_t *ctx, void *output, const void *input, size_t inlen, uint64_t seq, const void *aad,
                         size_t aadlen)
{
    size_t off = 0;

    ptls_aead_encrypt_init(ctx, seq, aad, aadlen);
    off += ptls_aead_encrypt_update(ctx, ((uint8_t *)output) + off, input, inlen);
    off += ptls_aead_encrypt_final(ctx, ((uint8_t *)output) + off);

    return off;
}